

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags,float row_min_height)

{
  ImGuiTable *table;
  uint uVar1;
  float fVar2;
  float fVar3;
  
  table = GImGui->CurrentTable;
  if (table->IsLayoutLocked == false) {
    TableUpdateLayout(table);
  }
  if (table->IsInsideRow == true) {
    TableEndRow(table);
  }
  *(uint *)&table->field_0x90 = row_flags & 0xffffU | *(int *)&table->field_0x90 << 0x10;
  table->RowMinHeight = row_min_height;
  TableBeginRow(table);
  fVar2 = table->CellPaddingY + table->CellPaddingY + table->RowPosY2;
  fVar3 = row_min_height + table->RowPosY1;
  uVar1 = -(uint)(fVar3 <= fVar2);
  table->RowPosY2 = (float)(~uVar1 & (uint)fVar3 | (uint)fVar2 & uVar1);
  table->InnerWindow->SkipItems = true;
  return;
}

Assistant:

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags, float row_min_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);
    if (table->IsInsideRow)
        TableEndRow(table);

    table->LastRowFlags = table->RowFlags;
    table->RowFlags = row_flags;
    table->RowMinHeight = row_min_height;
    TableBeginRow(table);

    // We honor min_row_height requested by user, but cannot guarantee per-row maximum height,
    // because that would essentially require a unique clipping rectangle per-cell.
    table->RowPosY2 += table->CellPaddingY * 2.0f;
    table->RowPosY2 = ImMax(table->RowPosY2, table->RowPosY1 + row_min_height);

    // Disable output until user calls TableNextColumn()
    table->InnerWindow->SkipItems = true;
}